

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

bool __thiscall Js::JavascriptSet::IsInIntSet(JavascriptSet *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BVIndex i;
  undefined4 *puVar4;
  Var aValue;
  BVSparse<Memory::Recycler> *this_00;
  int32 intVal;
  Var taggedInt;
  Var value_local;
  JavascriptSet *this_local;
  
  if (this->kind != IntSet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x1e1,"(this->kind == SetKind::IntSet)",
                                "this->kind == SetKind::IntSet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  aValue = JavascriptConversion::TryCanonicalizeAsTaggedInt<false,true>(value);
  if (aValue == (Var)0x0) {
    this_local._7_1_ = false;
  }
  else {
    i = TaggedInt::ToInt32(aValue);
    this_00 = Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator->
                        ((WriteBarrierPtr<BVSparse<Memory::Recycler>_> *)&(this->u).simpleVarSet);
    BVar3 = BVSparse<Memory::Recycler>::Test(this_00,i);
    this_local._7_1_ = BVar3 != '\0';
  }
  return this_local._7_1_;
}

Assistant:

bool
JavascriptSet::IsInIntSet(Var value)
{
    Assert(this->kind == SetKind::IntSet);
    Var taggedInt = JavascriptConversion::TryCanonicalizeAsTaggedInt<false /* allowNegOne */, true /* allowLossyConversion */>(value);
    if (!taggedInt)
    {
        return false;
    }
    int32 intVal = TaggedInt::ToInt32(taggedInt);
    return this->u.intSet->Test(intVal);
}